

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

VectorSet<const_llvm::Value_*> * __thiscall
dg::vr::ValueRelations::getValsByPtr
          (VectorSet<const_llvm::Value_*> *__return_storage_ptr__,ValueRelations *this,V from)

{
  pointer prVar1;
  HandlePtr pBVar2;
  const_iterator cVar3;
  key_type local_18;
  
  pBVar2 = maybeGet(this,from);
  if (pBVar2 != (HandlePtr)0x0) {
    prVar1 = (pBVar2->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar1 == (pBVar2->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_18._M_data = (Bucket *)0x0;
    }
    else {
      local_18._M_data = prVar1->_M_data;
    }
    if (local_18._M_data != (Bucket *)0x0) {
      cVar3 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(this->bucketToVals)._M_t,&local_18);
      std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
                (&__return_storage_ptr__->vec,
                 (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                 &cVar3._M_node[1]._M_parent);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

VectorSet<ValueRelations::V> ValueRelations::getValsByPtr(V from) const {
    HandlePtr mH = maybeGet(from);
    if (!mH)
        return {};
    HandlePtr toH = getHandleByPtr(*mH);
    if (!toH)
        return {};
    return getEqual(*toH);
}